

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O1

bool sensors_analytics::Sdk::AssertKey(string *type,string *key)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  uVar3 = key->_M_string_length;
  if (uVar3 - 0x65 < 0xffffffffffffff9c) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"The ",4);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(type->_M_dataplus)._M_p,type->_M_string_length);
    pcVar6 = " is empty or too long, max length is 100";
    lVar5 = 0x28;
  }
  else {
    pcVar6 = (key->_M_dataplus)._M_p;
    cVar1 = *pcVar6;
    if ((cVar1 == '$' || (byte)(cVar1 + 0x9fU) < 0x1a) ||
       (cVar1 == '_' || (byte)(cVar1 + 0xbfU) < 0x1a)) {
      bVar8 = uVar3 < 2;
      if (bVar8) {
        return bVar8;
      }
      uVar7 = 2;
      while (((bVar2 = pcVar6[uVar7 - 1],
              (byte)((bVar2 & 0xdf) + 0xbf) < 0x1a || (byte)(bVar2 - 0x30) < 10 || (bVar2 == 0x24))
             || (bVar2 == 0x5f))) {
        bVar8 = uVar3 <= uVar7;
        bVar9 = uVar7 == uVar3;
        uVar7 = uVar7 + 1;
        if (bVar9) {
          return bVar8;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"The ",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(type->_M_dataplus)._M_p,type->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4," need to be a valid variable name.",0x22);
      return bVar8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"The ",4);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(type->_M_dataplus)._M_p,type->_M_string_length);
    pcVar6 = " need to be a valid variable name.";
    lVar5 = 0x22;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
  return false;
}

Assistant:

bool Sdk::AssertKey(const string &type, const string &key) {
  size_t len = key.length();
  if (len < 1 || len > 100) {
    std::cerr << "The " << type << " is empty or too long, max length is 100";
    return false;
  }
  char ch = key[0];
  if ((ch >= 'a' && ch <= 'z') || ch == '$' ||
      (ch >= 'A' && ch <= 'Z') || ch == '_') {
    for (size_t i = 1; i < len; ++i) {
      ch = key[i];
      if ((ch >= 'a' && ch <= 'z') || (ch >= '0' && ch <= '9') ||
          (ch >= 'A' && ch <= 'Z') || ch == '$' || ch == '_') {
        continue;
      }
      std::cerr << "The " << type << " need to be a valid variable name.";
      return false;
    }
    return true;
  } else {
    std::cerr << "The " << type << " need to be a valid variable name.";
    return false;
  }
}